

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

char * makekey(uint8 *data,size_t len,char *key)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  
  pcVar1 = (char *)__ckd_calloc__(len * 2 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/hash_table.c"
                                  ,0xdd);
  lVar2 = 0;
  if (len != 0) {
    sVar3 = 0;
    do {
      pcVar1[lVar2] = (data[sVar3] & 0xf) + 0x41;
      pcVar1[lVar2 + 1] = (data[sVar3] >> 4) + 0x4a;
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + 2;
    } while (len != sVar3);
  }
  pcVar1[lVar2] = '\0';
  return pcVar1;
}

Assistant:

static char *
makekey(uint8 * data, size_t len, char *key)
{
    size_t i, j;

    if (!key)
        key = (char *) ckd_calloc(len * 2 + 1, sizeof(char));

    for (i = 0, j = 0; i < len; i++, j += 2) {
        key[j] = 'A' + (data[i] & 0x000f);
        key[j + 1] = 'J' + ((data[i] >> 4) & 0x000f);
    }
    key[j] = '\0';

    return key;
}